

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O0

void wallet::CHDChain::SerializationOps<DataStream,wallet::CHDChain_const,ActionSerialize>
               (DataStream *param_1,int *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ActionSerialize::SerReadWriteMany<DataStream,int,unsigned_int,CKeyID>
            (param_1,param_2,(uint *)in_stack_ffffffffffffffd8,(CKeyID *)0xb978c1);
  if (1 < *(int *)&param_1[1].vch.
                   super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
    ActionSerialize::SerReadWriteMany<DataStream,unsigned_int>
              (in_stack_ffffffffffffffd8,(uint *)0xb978df);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CHDChain, obj)
    {
        READWRITE(obj.nVersion, obj.nExternalChainCounter, obj.seed_id);
        if (obj.nVersion >= VERSION_HD_CHAIN_SPLIT) {
            READWRITE(obj.nInternalChainCounter);
        }
    }